

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestRequiredNoMaskMulti::Clear(TestRequiredNoMaskMulti *this)

{
  uint32_t *puVar1;
  uint32_t cached_has_bits;
  TestRequiredNoMaskMulti *this_local;
  
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 0x7f) != 0) {
    memset((void *)((long)&this->field_0 + 8),0,0x18);
    (this->field_0)._impl_.required_enum_1_ = 4;
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestRequiredNoMaskMulti::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestRequiredNoMaskMulti)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000007fu) != 0) {
    ::memset(&_impl_.required_enum_2_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.required_fixed32_80_) -
        reinterpret_cast<char*>(&_impl_.required_enum_2_)) + sizeof(_impl_.required_fixed32_80_));
    _impl_.required_enum_1_ = 4;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}